

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vcgen_stroke.cpp
# Opt level: O3

uint __thiscall agg::vcgen_stroke::vertex(vcgen_stroke *this,double *x,double *y)

{
  coord_storage *vc;
  uint uVar1;
  vertex_dist *pvVar2;
  vertex_dist **ppvVar3;
  point_base<double> *ppVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  FILE *__stream;
  
  vc = &this->m_out_vertices;
  uVar9 = 2;
  __stream = (FILE *)x;
switchD_0011bd16_default:
  switch(this->m_status) {
  case initial:
    rewind(this,__stream);
    break;
  case cap1:
    pvVar2 = *(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks;
    __stream = (FILE *)vc;
    math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_cap
              (&this->m_stroker,vc,pvVar2,pvVar2 + 1,pvVar2->dist);
    this->m_status = out_vertices;
    this->m_prev_status = outline1;
    this->m_src_vertex = 1;
    this->m_out_vertex = 0;
    goto switchD_0011bd16_default;
  case cap2:
    uVar6 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size;
    uVar1 = uVar6 - 1;
    ppvVar3 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks;
    uVar6 = uVar6 - 2;
    pvVar2 = ppvVar3[uVar6 >> 6] + (uVar6 & 0x3f);
    __stream = (FILE *)vc;
    math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_cap
              (&this->m_stroker,vc,
               (vertex_dist *)((long)&ppvVar3[uVar1 >> 6]->x + (ulong)((uVar1 & 0x3f) * 0x18)),
               pvVar2,pvVar2->dist);
    this->m_status = out_vertices;
    this->m_prev_status = outline2;
    this->m_out_vertex = 0;
    goto switchD_0011bd16_default;
  case outline1:
    uVar1 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size;
    __stream = (FILE *)(ulong)uVar1;
    uVar6 = this->m_src_vertex;
    if (this->m_closed == 0) {
      if (uVar1 - 1 <= uVar6) {
        this->m_status = cap2;
        goto switchD_0011bd16_default;
      }
    }
    else if (uVar1 <= uVar6) {
      this->m_status = end_poly1;
      this->m_prev_status = close_first;
      goto switchD_0011bd16_default;
    }
    uVar7 = (ulong)((uVar6 + uVar1) - 1) % (ulong)__stream;
    ppvVar3 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks;
    uVar5 = (ulong)(uVar6 + 1) % (ulong)__stream;
    __stream = (FILE *)vc;
    math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_join
              (&this->m_stroker,vc,ppvVar3[uVar7 >> 6] + ((uint)uVar7 & 0x3f),
               ppvVar3[uVar6 >> 6] + (uVar6 & 0x3f),
               (vertex_dist *)((long)&ppvVar3[uVar5 >> 6]->x + (ulong)(((uint)uVar5 & 0x3f) * 0x18))
               ,ppvVar3[uVar7 >> 6][(uint)uVar7 & 0x3f].dist,ppvVar3[uVar6 >> 6][uVar6 & 0x3f].dist)
    ;
    this->m_src_vertex = this->m_src_vertex + 1;
    goto LAB_0011bf79;
  case close_first:
    this->m_status = outline2;
    uVar9 = 1;
  case outline2:
    uVar1 = this->m_src_vertex;
    __stream = (FILE *)(ulong)uVar1;
    if ((this->m_closed == 0) < uVar1) {
      uVar8 = uVar1 - 1;
      this->m_src_vertex = uVar8;
      uVar6 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size;
      uVar7 = (ulong)uVar1 % (ulong)uVar6;
      ppvVar3 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks;
      uVar5 = (ulong)((uVar1 + uVar6) - 2) % (ulong)uVar6;
      __stream = (FILE *)vc;
      math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_join
                (&this->m_stroker,vc,
                 (vertex_dist *)
                 ((long)&ppvVar3[uVar7 >> 6]->x + (ulong)(((uint)uVar7 & 0x3f) * 0x18)),
                 ppvVar3[uVar8 >> 6] + (uVar8 & 0x3f),ppvVar3[uVar5 >> 6] + ((uint)uVar5 & 0x3f),
                 ppvVar3[uVar8 >> 6][uVar8 & 0x3f].dist,ppvVar3[uVar5 >> 6][(uint)uVar5 & 0x3f].dist
                );
LAB_0011bf79:
      this->m_prev_status = this->m_status;
      this->m_status = out_vertices;
      this->m_out_vertex = 0;
    }
    else {
      this->m_status = end_poly2;
      this->m_prev_status = stop;
    }
    goto switchD_0011bd16_default;
  case out_vertices:
    goto switchD_0011bd16_caseD_7;
  case end_poly1:
    goto switchD_0011bd16_caseD_8;
  case end_poly2:
    this->m_status = this->m_prev_status;
    return 0x6f;
  case stop:
    goto LAB_0011c01a;
  default:
    goto switchD_0011bd16_default;
  }
  if ((this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size <
      3 - (this->m_closed == 0)) {
LAB_0011c01a:
    return 0;
  }
  this->m_status = (uint)(this->m_closed != 0) * 2 + cap1;
  this->m_src_vertex = 0;
  this->m_out_vertex = 0;
  uVar9 = 1;
  goto switchD_0011bd16_default;
switchD_0011bd16_caseD_7:
  uVar1 = this->m_out_vertex;
  if (uVar1 < (this->m_out_vertices).m_size) {
    this->m_out_vertex = uVar1 + 1;
    ppVar4 = (this->m_out_vertices).m_blocks[uVar1 >> 6];
    uVar7 = (ulong)((uVar1 & 0x3f) << 4);
    *x = *(double *)((long)&ppVar4->x + uVar7);
    *y = *(double *)((long)&ppVar4->y + uVar7);
    return uVar9;
  }
  this->m_status = this->m_prev_status;
  goto switchD_0011bd16_default;
switchD_0011bd16_caseD_8:
  this->m_status = this->m_prev_status;
  return 0x5f;
}

Assistant:

unsigned vcgen_stroke::vertex(double* x, double* y)
    {
        unsigned cmd = path_cmd_line_to;
        while(!is_stop(cmd))
        {
            switch(m_status)
            {
            case initial:
                rewind(0);

            case ready:
                if(m_src_vertices.size() < 2 + unsigned(m_closed != 0))
                {
                    cmd = path_cmd_stop;
                    break;
                }
                m_status = m_closed ? outline1 : cap1;
                cmd = path_cmd_move_to;
                m_src_vertex = 0;
                m_out_vertex = 0;
                break;

            case cap1:
                m_stroker.calc_cap(m_out_vertices,
                                   m_src_vertices[0], 
                                   m_src_vertices[1], 
                                   m_src_vertices[0].dist);
                m_src_vertex = 1;
                m_prev_status = outline1;
                m_status = out_vertices;
                m_out_vertex = 0;
                break;

            case cap2:
                m_stroker.calc_cap(m_out_vertices,
                                   m_src_vertices[m_src_vertices.size() - 1], 
                                   m_src_vertices[m_src_vertices.size() - 2], 
                                   m_src_vertices[m_src_vertices.size() - 2].dist);
                m_prev_status = outline2;
                m_status = out_vertices;
                m_out_vertex = 0;
                break;

            case outline1:
                if(m_closed)
                {
                    if(m_src_vertex >= m_src_vertices.size())
                    {
                        m_prev_status = close_first;
                        m_status = end_poly1;
                        break;
                    }
                }
                else
                {
                    if(m_src_vertex >= m_src_vertices.size() - 1)
                    {
                        m_status = cap2;
                        break;
                    }
                }
                m_stroker.calc_join(m_out_vertices, 
                                    m_src_vertices.prev(m_src_vertex), 
                                    m_src_vertices.curr(m_src_vertex), 
                                    m_src_vertices.next(m_src_vertex), 
                                    m_src_vertices.prev(m_src_vertex).dist,
                                    m_src_vertices.curr(m_src_vertex).dist);
                ++m_src_vertex;
                m_prev_status = m_status;
                m_status = out_vertices;
                m_out_vertex = 0;
                break;

            case close_first:
                m_status = outline2;
                cmd = path_cmd_move_to;

            case outline2:
                if(m_src_vertex <= unsigned(m_closed == 0))
                {
                    m_status = end_poly2;
                    m_prev_status = stop;
                    break;
                }

                --m_src_vertex;
                m_stroker.calc_join(m_out_vertices,
                                    m_src_vertices.next(m_src_vertex), 
                                    m_src_vertices.curr(m_src_vertex), 
                                    m_src_vertices.prev(m_src_vertex), 
                                    m_src_vertices.curr(m_src_vertex).dist, 
                                    m_src_vertices.prev(m_src_vertex).dist);

                m_prev_status = m_status;
                m_status = out_vertices;
                m_out_vertex = 0;
                break;

            case out_vertices:
                if(m_out_vertex >= m_out_vertices.size())
                {
                    m_status = m_prev_status;
                }
                else
                {
                    const point_d& c = m_out_vertices[m_out_vertex++];
                    *x = c.x;
                    *y = c.y;
                    return cmd;
                }
                break;

            case end_poly1:
                m_status = m_prev_status;
                return path_cmd_end_poly | path_flags_close | path_flags_ccw;

            case end_poly2:
                m_status = m_prev_status;
                return path_cmd_end_poly | path_flags_close | path_flags_cw;

            case stop:
                cmd = path_cmd_stop;
                break;
            }
        }
        return cmd;
    }